

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSorter.cpp
# Opt level: O1

void sortHeaders(vector<Header,_std::allocator<Header>_> *headers)

{
  ushort uVar1;
  pointer pHVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  __hash_code __code;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  Header *__a;
  ulong uVar9;
  long *plVar10;
  vector<Header,_std::allocator<Header>_> *pvVar11;
  ulong uVar12;
  __node_base *p_Var13;
  bool bVar14;
  pointer pHVar15;
  long lVar16;
  byte bVar17;
  undefined1 local_90 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  observedIDs;
  uint local_44;
  vector<Header,_std::allocator<Header>_> *local_40;
  vector<Header,_std::allocator<Header>_> *__range1;
  
  local_40 = headers;
  do {
    local_90 = (undefined1  [8])&observedIDs._M_h._M_rehash_policy._M_next_resize;
    observedIDs._M_h._M_buckets = (__buckets_ptr)0x1;
    observedIDs._M_h._M_bucket_count = 0;
    observedIDs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    observedIDs._M_h._M_element_count._0_4_ = 0x3f800000;
    observedIDs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    observedIDs._M_h._M_rehash_policy._4_4_ = 0;
    observedIDs._M_h._M_rehash_policy._M_next_resize = 0;
    pHVar15 = (local_40->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pHVar2 = (local_40->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar17 = pHVar15 == pHVar2;
    if (!(bool)bVar17) {
      __range1._0_4_ = 0;
      do {
        local_44 = (uint)pHVar15->m_id;
        __range1._7_1_ = bVar17;
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_emplace<unsigned_int>
                  ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_90,&local_44);
        p_Var13 = &(pHVar15->m_dependancies)._M_h._M_before_begin;
        uVar12 = (ulong)(uint)__range1;
        bVar14 = false;
        pvVar11 = local_40;
        uVar6 = (uint)__range1;
        observedIDs._M_h._M_single_bucket = (__node_base_ptr)pHVar15;
        while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
          uVar1 = (ushort)*(size_type *)(p_Var13 + 1);
          plVar3 = *(long **)((long)local_90 +
                             ((ulong)uVar1 % (ulong)observedIDs._M_h._M_buckets & 0xffffffff) * 8);
          plVar5 = (long *)0x0;
          if (plVar3 != (long *)0x0) {
            plVar5 = plVar3;
            plVar10 = (long *)*plVar3;
            if (*(uint *)((long *)*plVar3 + 1) != (uint)uVar1) {
              while (plVar3 = (long *)*plVar10, plVar3 != (long *)0x0) {
                plVar5 = (long *)0x0;
                if (((ulong)*(uint *)(plVar3 + 1) % (ulong)observedIDs._M_h._M_buckets !=
                     (ulong)uVar1 % (ulong)observedIDs._M_h._M_buckets) ||
                   (plVar5 = plVar10, plVar10 = plVar3, *(uint *)(plVar3 + 1) == (uint)uVar1))
                goto LAB_001075b5;
              }
              plVar5 = (long *)0x0;
            }
          }
LAB_001075b5:
          if ((plVar5 == (long *)0x0) || (*plVar5 == 0)) {
            pHVar15 = (pvVar11->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar7 = ((long)(pvVar11->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pHVar15 >> 4) *
                    0x2e8ba2e8ba2e8ba3;
            uVar4 = 0xffffffff;
            if (uVar12 <= uVar7 && uVar7 - uVar12 != 0) {
              uVar8 = (ulong)uVar6;
              uVar9 = uVar12;
              do {
                uVar4 = (uint)uVar8;
                if (pHVar15[uVar9].m_id == uVar1) break;
                uVar8 = (ulong)((uint)uVar8 + 1);
                uVar9 = uVar8;
                uVar4 = 0xffffffff;
              } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
            }
            bVar14 = true;
            if (uVar6 < uVar4) {
              uVar7 = (ulong)uVar4;
              lVar16 = uVar7 * 0xb0;
              do {
                __a = (Header *)
                      ((long)&(((pvVar11->super__Vector_base<Header,_std::allocator<Header>_>).
                                _M_impl.super__Vector_impl_data._M_start)->m_fileContents).
                              _M_dataplus._M_p + lVar16);
                uVar7 = uVar7 - 1;
                std::swap<Header>(__a,__a + -1);
                lVar16 = lVar16 + -0xb0;
                pvVar11 = local_40;
              } while (uVar12 < uVar7);
              bVar14 = true;
              uVar6 = (uint)__range1;
            }
          }
          bVar17 = __range1._7_1_;
          if (bVar14) goto LAB_00107679;
        }
        __range1._0_4_ = uVar6 + 1;
        pHVar15 = (pointer)(observedIDs._M_h._M_single_bucket + 0x16);
        bVar17 = pHVar15 == pHVar2;
      } while (!(bool)bVar17);
    }
LAB_00107679:
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_90);
    if ((bVar17 & 1) != 0) {
      return;
    }
  } while( true );
}

Assistant:

void sortHeaders(std::vector<Header>& headers)
{
    /*
    std::vector<Header> sortedHeaders;

    for (auto& header : headers) {
        bool hasDependancy = false;
        std::cout << "ITR\n";
        for (int i = 0; i < sortedHeaders.size(); i++) {
            auto& d = header.getDependancies();
            if (d.find(sortedHeaders[i].getID()) != d.end()) {
                sortedHeaders.insert(sortedHeaders.begin(), header);
                hasDependancy = true;
                break;
            }
        }
        if (!hasDependancy) {
            sortedHeaders.push_back(header);
        }
    }

    headers = sortedHeaders;
    */
   while (!isSorted(headers));
}